

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

atom * newAtom(char *rec,int file,int model,residue *resDataBuf)

{
  char cVar1;
  int iVar2;
  int useCOScale;
  atom *a_00;
  char *pcVar3;
  float fVar4;
  char local_98 [8];
  char msg [100];
  atom *a;
  residue *resDataBuf_local;
  int model_local;
  int file_local;
  char *rec_local;
  
  a_00 = (atom *)malloc(0x80);
  if (a_00 == (atom *)0x0) {
    warn("could not allocate space for new atom");
  }
  else {
    a_00->r = resDataBuf;
    a_00->next = (atom_t *)0x0;
    a_00->nextInBin = (atom_t *)0x0;
    a_00->scratch = (atom_t *)0x0;
    a_00->mark = 0;
    a_00->flags = 0;
    a_00->props = 0;
    parseResidueName(rec,a_00->r->resname);
    parseAtomName(rec,a_00->atomname);
    a_00->r->a = a_00;
    a_00->r->file = file;
    a_00->r->model = model;
    parseChain(rec,a_00->r->chain);
    iVar2 = parseResidueNumber(rec);
    a_00->r->resid = iVar2;
    parseResidueHy36Num(rec,a_00->r->Hy36resno);
    cVar1 = parseResidueInsertionCode(rec);
    a_00->r->resInsCode = cVar1;
    a_00->r->rescnt = 0;
    cVar1 = parseAltLocCode(rec);
    a_00->altConf = cVar1;
    a_00->binSerialNum = '?';
    pcVar3 = strstr(":ASX:GLX:ASN:GLN:",a_00->r->resname);
    if ((pcVar3 == (char *)0x0) || (a_00->atomname[1] != 'A')) {
      iVar2 = identifyAtom(a_00->atomname,a_00->r->resname,Verbose);
      a_00->elem = iVar2;
    }
    else {
      iVar2 = identifyAtom(" O  ",a_00->r->resname,Verbose);
      a_00->elem = iVar2;
      sprintf(local_98,"atom %s will be treated as oxygen",a_00->atomname);
      warn(local_98);
    }
    a_00->bondedto = (char *)0x0;
    iVar2 = getAtno(a_00->elem);
    if (iVar2 == 1) {
      a_00->atomclass = -1;
      if (UseHParent != 0) {
        pcVar3 = setHydrogenParentName(a_00->r->resname,a_00->atomname);
        a_00->bondedto = pcVar3;
      }
    }
    else {
      a_00->atomclass = a_00->elem;
      if (UseStdBond != 0) {
        pcVar3 = setMainchainBonding(a_00->r->resname,a_00->atomname);
        a_00->bondedto = pcVar3;
      }
    }
    iVar2 = isHet(rec);
    setProperties(a_00,iVar2,HB2aromFace,PermitCHXHB);
    if (ByNABaseColor != 0) {
      iVar2 = naBaseCategory(a_00);
      a_00->atomclass = iVar2;
    }
    parseXYZ(rec,&a_00->loc);
    a_00->iz = 0;
    a_00->iy = 0;
    a_00->ix = 0;
    fVar4 = parseOccupancy(rec);
    a_00->occ = fVar4;
    fVar4 = parseTempFactor(rec);
    a_00->bval = fVar4;
    parseSegID(rec,a_00->r->segid);
    iVar2 = strncmp(a_00->r->segid,"    ",4);
    if ((iVar2 != 0) && (iVar2 = strncmp(a_00->r->chain,"  ",2), iVar2 == 0)) {
      a_00->r->chain[0] = a_00->r->segid[0];
      a_00->r->chain[1] = a_00->r->segid[1];
      a_00->r->chain[2] = a_00->r->segid[2];
      a_00->r->chain[3] = a_00->r->segid[3];
      a_00->r->chain[4] = '\0';
    }
    iVar2 = a_00->elem;
    useCOScale = isCarbonylAtom(a_00);
    fVar4 = getRadius(iVar2,useCOScale);
    a_00->radius = fVar4;
    fVar4 = getCovRad(a_00->elem);
    a_00->covRad = fVar4;
  }
  return a_00;
}

Assistant:

atom * newAtom(char *rec, int file, int model, residue * resDataBuf)
{/*newAtom()*/
   atom *a = NULL;
   char msg[100];

   a = (atom *)malloc(sizeof(atom));
   if (a) {
      a->r = resDataBuf;

      a->next     = NULL;
      a->nextInBin= NULL;
      a->scratch  = NULL;
      a->mark = 0;    /* used to mark bonds */
      a->flags = 0;
      a->props = 0;
      parseResidueName(rec, a->r->resname);
      parseAtomName(rec, a->atomname);
      a->r->a = a; /* residue points back to this atom (can change for res) */
      a->r->file = file;
      a->r->model = model;
      parseChain(rec, a->r->chain);
     /* a->r->chain = parseChain(rec);*/
      a->r->resid = parseResidueNumber(rec);
      parseResidueHy36Num(rec, a->r->Hy36resno);
      a->r->resInsCode = parseResidueInsertionCode(rec);
      a->r->rescnt = 0;
      a->altConf = parseAltLocCode(rec);
      a->binSerialNum = '?'; /* set when we bin */
      if (strstr(":ASX:GLX:ASN:GLN:", a->r->resname) /* special case treats undecided */
      && (a->atomname[1] == 'A')) {             /* as an oxygen */
	 a->elem = identifyAtom(" O  ", a->r->resname, Verbose); /*dcr041007 allow warning  add resname to call */
	 sprintf(msg, "atom %s will be treated as oxygen", a->atomname);
	 warn(msg);
      }
      else { /* normal case */
	 a->elem = identifyAtom(a->atomname, a->r->resname, Verbose);/*dcr041007 allow warning  add resname to call */
      }

      /*next section seems to be the only place where atom->bondedto is set.*/
      /*select.c/setHydrogenParentName() and select.c/setMainchainBonding()*/
      /* both merely call stdconntable.c/searchForStdBondingPartner() */
      /* which constructs a search string from (a->r->resname, a->atomname) */
      /* and calls stdconntable.c/SearchStdResConnTable()  */
      /* which returns the string found in the StdResTblBucket[] hash table.*/
      /*This hash table is a marvelous tour de force listing of names of*/
      /*residue/atoms and what atoms they can be bonded to */

      a->bondedto = NULL;
      if (isHatom(a->elem)) {
	 a->atomclass = -1; /* to be specified later */
	 if (UseHParent) {
	    a->bondedto = setHydrogenParentName(a->r->resname, a->atomname);
	 }
      }
      else {
	 a->atomclass = a->elem;
	 if (UseStdBond) {
	    a->bondedto = setMainchainBonding(a->r->resname, a->atomname);

            /*setMainchainBonding() does not seem to have a distance limit*/
	 }
      }

      setProperties(a, isHet(rec), HB2aromFace, PermitCHXHB); /*select.c*/
        /*This is where (e.g.) both HET_PROP and DNA_PROP are set for the atom*/
      if (ByNABaseColor) {  /* forces coloring by base rather than atom type */
	 a->atomclass = naBaseCategory(a);
      }

      parseXYZ(rec, &(a->loc));
      a->ix = a->iy = a->iz = 0;

   /* note: H DONOR_PROP assignment done later in updateHydrogenInfo() */

      a->occ  = parseOccupancy(rec);
      a->bval = parseTempFactor(rec);
      parseSegID(rec, a->r->segid);

      //use SEGID instead of chainID if it exists and chainID is blank
      if ( (strncmp(a->r->segid, "    ",4) != 0) &&
           (strncmp(a->r->chain, "  ",2)   == 0)){
        //parseSegID(rec, a->r->chain);
        a->r->chain[0] = a->r->segid[0];
        a->r->chain[1] = a->r->segid[1];
        a->r->chain[2] = a->r->segid[2];
        a->r->chain[3] = a->r->segid[3];
        a->r->chain[4] = '\0';
      }

      a->radius = getRadius(a->elem, isCarbonylAtom(a));
      a->covRad = getCovRad(a->elem);
   }
   else {
      warn("could not allocate space for new atom");
   }
   return a;
}